

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O2

int dlep_session_generate_signal
              (dlep_session *session,int32_t signal,oonf_layer2_neigh_key *neighbor)

{
  int iVar1;
  
  iVar1 = _generate_signal(session,signal,neighbor);
  if (iVar1 != 0) {
    if ((log_global_mask[session->log_source] & 4) != 0) {
      oonf_log(LOG_SEVERITY_WARN,session->log_source,"src/generic/dlep/dlep_session.c",0x277,
               (void *)0x0,0,"Could not generate signal %u",signal);
    }
    return -1;
  }
  iVar1 = dlep_writer_finish_signal(&session->writer,session->log_source);
  return iVar1;
}

Assistant:

int
dlep_session_generate_signal(struct dlep_session *session, int32_t signal, const struct oonf_layer2_neigh_key *neighbor) {
  if (_generate_signal(session, signal, neighbor)) {
    OONF_WARN(session->log_source, "Could not generate signal %u", signal);
    return -1;
  }
  return dlep_writer_finish_signal(&session->writer, session->log_source);
}